

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

StringToInt64Map *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::StringToInt64Map>
          (Arena *arena)

{
  StringToInt64Map *this;
  
  if (arena == (Arena *)0x0) {
    this = (StringToInt64Map *)operator_new(0x48);
    CoreML::Specification::StringToInt64Map::StringToInt64Map(this,(Arena *)0x0,false);
  }
  else {
    this = (StringToInt64Map *)
           AllocateAlignedWithHook
                     (arena,0x48,(type_info *)&CoreML::Specification::StringToInt64Map::typeinfo);
    CoreML::Specification::StringToInt64Map::StringToInt64Map(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }